

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void helics::apps::fedConnectionList(ConnectionsList *connections,json *fed)

{
  pointer *ppbVar1;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pdVar2;
  long lVar3;
  value_t vVar4;
  iterator iVar5;
  bool bVar6;
  const_iterator cVar7;
  const_reference pvVar8;
  reference pbVar9;
  reference pvVar10;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  __hashtable *__h_2;
  __hashtable *__h;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  const_iterator __end3_7;
  const_iterator __end3;
  string_view input1;
  const_iterator __begin3;
  string_view endpoint1;
  string_view pub1_2;
  string_view input1_2;
  string_view pubAlias;
  string_view inputAlias;
  string_view eptAlias;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_300;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_2e0;
  string local_2d8;
  _Rb_tree_node_base *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  TemplateMatcher local_2a8;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_200;
  size_type local_1f8;
  undefined8 uStack_1f0;
  _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_1e8;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  size_type local_40;
  pointer local_38;
  
  if (((fed->m_data).m_type == object) &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[5],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          *)(fed->m_data).m_value.object,(char (*) [5])"tags"),
     (_Rb_tree_header *)cVar7._M_node !=
     &(((fed->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)fed,"tags");
    loadTags(connections,pvVar8);
  }
  local_2e0 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)fed;
  if (((fed->m_data).m_type == object) &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[17],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          *)(fed->m_data).m_value.object,(char (*) [17])0x4185e2),
     (_Rb_tree_header *)cVar7._M_node !=
     &(((fed->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)fed,"connected_inputs");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)&local_2a8,pvVar8);
    vVar4 = (pvVar8->m_data).m_type;
    local_300.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_300.m_it.array_iterator._M_current = (pointer)0x0;
    local_300.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (vVar4 == array) {
      local_300.m_it.array_iterator._M_current =
           (((pvVar8->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (vVar4 == object) {
      local_300.m_it.object_iterator._M_node =
           &(((pvVar8->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_300.m_it.primitive_iterator.m_it = 1;
    }
    local_300.m_object = pvVar8;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_300), fed = (json *)local_2e0, !bVar6) {
      pbVar9 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_320,pbVar9);
      pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &connections->interfaces,&local_320);
      local_2d8._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
      local_2d8._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      local_320._M_dataplus._M_p = (pointer)&connections->inputs;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&connections->inputs,&local_2d8,&local_320);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar3 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar3;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar3 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar3 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar3 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar3;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
      }
    }
  }
  if ((*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)fed ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[23],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)((long)fed + 8),(char (*) [23])0x4185f5),
     cVar7._M_node != (_Base_ptr)(*(long *)((long)fed + 8) + 8))) {
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)fed,"connected_publications");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)&local_2a8,pvVar8);
    vVar4 = (pvVar8->m_data).m_type;
    local_300.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_300.m_it.array_iterator._M_current = (pointer)0x0;
    local_300.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (vVar4 == array) {
      local_300.m_it.array_iterator._M_current =
           (((pvVar8->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (vVar4 == object) {
      local_300.m_it.object_iterator._M_node =
           &(((pvVar8->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_300.m_it.primitive_iterator.m_it = 1;
    }
    local_300.m_object = pvVar8;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_300), fed = (json *)local_2e0, !bVar6) {
      pbVar9 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_320,pbVar9);
      pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &connections->interfaces,&local_320);
      local_2d8._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
      local_2d8._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      local_320._M_dataplus._M_p = (pointer)&connections->pubs;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&connections->pubs,&local_2d8,&local_320);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar3 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar3;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar3 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar3 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar3 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar3;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
      }
    }
  }
  if ((*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)fed ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[19],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)((long)fed + 8),(char (*) [19])"unconnected_inputs"),
     cVar7._M_node != (_Base_ptr)(*(long *)((long)fed + 8) + 8))) {
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)fed,"unconnected_inputs");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)&local_2a8,pvVar8);
    vVar4 = (pvVar8->m_data).m_type;
    local_300.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_300.m_it.array_iterator._M_current = (pointer)0x0;
    local_300.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (vVar4 == array) {
      local_300.m_it.array_iterator._M_current =
           (((pvVar8->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (vVar4 == object) {
      local_300.m_it.object_iterator._M_node =
           &(((pvVar8->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_300.m_it.primitive_iterator.m_it = 1;
    }
    local_2b8 = (_Rb_tree_node_base *)&connections->unconnectedInputs;
    local_300.m_object = pvVar8;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_300), fed = (json *)local_2e0, !bVar6) {
      pbVar9 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_320,pbVar9);
      pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &connections->interfaces,&local_320);
      local_2d8._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
      local_2d8._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      iVar5._M_current =
           (connections->unconnectedInputs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (connections->unconnectedInputs).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)local_2b8,iVar5,(basic_string_view<char,_std::char_traits<char>_> *)&local_2d8
                  );
      }
      else {
        *(undefined4 *)&(iVar5._M_current)->_M_len = local_2d8._M_dataplus._M_p._0_4_;
        *(undefined4 *)((long)&(iVar5._M_current)->_M_len + 4) = local_2d8._M_dataplus._M_p._4_4_;
        *(undefined4 *)&(iVar5._M_current)->_M_str = (undefined4)local_2d8._M_string_length;
        *(undefined4 *)((long)&(iVar5._M_current)->_M_str + 4) = local_2d8._M_string_length._4_4_;
        ppbVar1 = &(connections->unconnectedInputs).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      local_320._M_dataplus._M_p = (pointer)&connections->inputs;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&connections->inputs,&local_2d8,&local_320);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar3 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar3;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar3 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar3 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar3 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar3;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
      }
    }
  }
  if ((*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)fed ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[25],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)((long)fed + 8),(char (*) [25])"unconnected_publications"),
     cVar7._M_node != (_Base_ptr)(*(long *)((long)fed + 8) + 8))) {
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)fed,"unconnected_publications");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)&local_2a8,pvVar8);
    vVar4 = (pvVar8->m_data).m_type;
    local_300.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_300.m_it.array_iterator._M_current = (pointer)0x0;
    local_300.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (vVar4 == array) {
      local_300.m_it.array_iterator._M_current =
           (((pvVar8->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (vVar4 == object) {
      local_300.m_it.object_iterator._M_node =
           &(((pvVar8->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_300.m_it.primitive_iterator.m_it = 1;
    }
    local_2b8 = (_Rb_tree_node_base *)&connections->unconnectedPubs;
    local_300.m_object = pvVar8;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_300), fed = (json *)local_2e0, !bVar6) {
      pbVar9 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_320,pbVar9);
      pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &connections->interfaces,&local_320);
      local_2d8._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
      local_2d8._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      iVar5._M_current =
           (connections->unconnectedPubs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (connections->unconnectedPubs).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)local_2b8,iVar5,(basic_string_view<char,_std::char_traits<char>_> *)&local_2d8
                  );
      }
      else {
        *(undefined4 *)&(iVar5._M_current)->_M_len = local_2d8._M_dataplus._M_p._0_4_;
        *(undefined4 *)((long)&(iVar5._M_current)->_M_len + 4) = local_2d8._M_dataplus._M_p._4_4_;
        *(undefined4 *)&(iVar5._M_current)->_M_str = (undefined4)local_2d8._M_string_length;
        *(undefined4 *)((long)&(iVar5._M_current)->_M_str + 4) = local_2d8._M_string_length._4_4_;
        ppbVar1 = &(connections->unconnectedPubs).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      local_320._M_dataplus._M_p = (pointer)&connections->pubs;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&connections->pubs,&local_2d8,&local_320);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar3 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar3;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar3 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar3 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar3 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar3;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
      }
    }
  }
  if ((*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)fed ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[29],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)((long)fed + 8),(char (*) [29])"unconnected_target_endpoints"),
     cVar7._M_node != (_Base_ptr)(*(long *)((long)fed + 8) + 8))) {
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)fed,"unconnected_target_endpoints");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)&local_2a8,pvVar8);
    vVar4 = (pvVar8->m_data).m_type;
    local_300.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_300.m_it.array_iterator._M_current = (pointer)0x0;
    local_300.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (vVar4 == array) {
      local_300.m_it.array_iterator._M_current =
           (((pvVar8->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (vVar4 == object) {
      local_300.m_it.object_iterator._M_node =
           &(((pvVar8->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_300.m_it.primitive_iterator.m_it = 1;
    }
    local_2b8 = (_Rb_tree_node_base *)&connections->unconnectedTargetEndpoints;
    local_300.m_object = pvVar8;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_300), fed = (json *)local_2e0, !bVar6) {
      pbVar9 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_320,pbVar9);
      pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &connections->interfaces,&local_320);
      local_2d8._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
      local_2d8._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      iVar5._M_current =
           (connections->unconnectedTargetEndpoints).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (connections->unconnectedTargetEndpoints).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)local_2b8,iVar5,(basic_string_view<char,_std::char_traits<char>_> *)&local_2d8
                  );
      }
      else {
        *(undefined4 *)&(iVar5._M_current)->_M_len = local_2d8._M_dataplus._M_p._0_4_;
        *(undefined4 *)((long)&(iVar5._M_current)->_M_len + 4) = local_2d8._M_dataplus._M_p._4_4_;
        *(undefined4 *)&(iVar5._M_current)->_M_str = (undefined4)local_2d8._M_string_length;
        *(undefined4 *)((long)&(iVar5._M_current)->_M_str + 4) = local_2d8._M_string_length._4_4_;
        ppbVar1 = &(connections->unconnectedTargetEndpoints).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      local_320._M_dataplus._M_p = (pointer)&connections->endpoints;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&connections->endpoints,&local_2d8,&local_320);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar3 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar3;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar3 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar3 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar3 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar3;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
      }
    }
  }
  if ((*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)fed ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[29],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)((long)fed + 8),(char (*) [29])"unconnected_source_endpoints"),
     cVar7._M_node != (_Base_ptr)(*(long *)((long)fed + 8) + 8))) {
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)fed,"unconnected_source_endpoints");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)&local_2a8,pvVar8);
    vVar4 = (pvVar8->m_data).m_type;
    local_300.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_300.m_it.array_iterator._M_current = (pointer)0x0;
    local_300.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (vVar4 == array) {
      local_300.m_it.array_iterator._M_current =
           (((pvVar8->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (vVar4 == object) {
      local_300.m_it.object_iterator._M_node =
           &(((pvVar8->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_300.m_it.primitive_iterator.m_it = 1;
    }
    local_2b8 = (_Rb_tree_node_base *)&connections->unconnectedSourceEndpoints;
    local_300.m_object = pvVar8;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_300), fed = (json *)local_2e0, !bVar6) {
      pbVar9 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_320,pbVar9);
      pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &connections->interfaces,&local_320);
      local_2d8._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
      local_2d8._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      iVar5._M_current =
           (connections->unconnectedSourceEndpoints).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (connections->unconnectedSourceEndpoints).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)local_2b8,iVar5,(basic_string_view<char,_std::char_traits<char>_> *)&local_2d8
                  );
      }
      else {
        *(undefined4 *)&(iVar5._M_current)->_M_len = local_2d8._M_dataplus._M_p._0_4_;
        *(undefined4 *)((long)&(iVar5._M_current)->_M_len + 4) = local_2d8._M_dataplus._M_p._4_4_;
        *(undefined4 *)&(iVar5._M_current)->_M_str = (undefined4)local_2d8._M_string_length;
        *(undefined4 *)((long)&(iVar5._M_current)->_M_str + 4) = local_2d8._M_string_length._4_4_;
        ppbVar1 = &(connections->unconnectedSourceEndpoints).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      local_320._M_dataplus._M_p = (pointer)&connections->endpoints;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&connections->endpoints,&local_2d8,&local_320);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar3 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar3;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar3 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar3 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar3 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar3;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
      }
    }
  }
  if ((*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)fed ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[20],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)((long)fed + 8),(char (*) [20])"connected_endpoints"),
     cVar7._M_node != (_Base_ptr)(*(long *)((long)fed + 8) + 8))) {
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)fed,"connected_endpoints");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)&local_2a8,pvVar8);
    vVar4 = (pvVar8->m_data).m_type;
    local_300.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_300.m_it.array_iterator._M_current = (pointer)0x0;
    local_300.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (vVar4 == array) {
      local_300.m_it.array_iterator._M_current =
           (((pvVar8->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (vVar4 == object) {
      local_300.m_it.object_iterator._M_node =
           &(((pvVar8->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_300.m_it.primitive_iterator.m_it = 1;
    }
    local_300.m_object = pvVar8;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_300), fed = (json *)local_2e0, !bVar6) {
      pbVar9 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_320,pbVar9);
      pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &connections->interfaces,&local_320);
      local_2d8._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
      local_2d8._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      local_320._M_dataplus._M_p = (pointer)&connections->endpoints;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&connections->endpoints,&local_2d8,&local_320);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar3 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar3;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar3 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar3 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar3 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar3;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
      }
    }
  }
  if ((*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)fed ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[21],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)((long)fed + 8),(char (*) [21])"potential_interfaces"),
     cVar7._M_node != (_Base_ptr)(*(long *)((long)fed + 8) + 8))) {
    connections->hasPotentialInterfaces = true;
    pbVar11 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)fed,"attributes");
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(pbVar11,"name");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_2a8,pvVar8);
    pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &connections->federatesWithPotentialInterfaces,&local_2a8.templateName);
    local_2b8 = (_Rb_tree_node_base *)(pvVar10->_M_dataplus)._M_p;
    local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pvVar10->_M_string_length;
    paVar13 = &local_2a8.templateName.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
      operator_delete(local_2a8.templateName._M_dataplus._M_p,
                      CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                               CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                        CONCAT24(local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._4_2_,
                                                 local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 1);
    }
    pbVar11 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(local_2e0,"potential_interfaces");
    local_200 = pbVar11;
    if ((*pbVar11 ==
         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          )0x1) &&
       (cVar7 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                ::_M_find_tr<char[7],void>
                          (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             **)(pbVar11 + 8),(char (*) [7])0x418504),
       cVar7._M_node != (_Base_ptr)(*(long *)(pbVar11 + 8) + 8))) {
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar11,"inputs");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::cbegin(&local_300,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)paVar12);
      local_320.field_2._8_8_ = 0x8000000000000000;
      local_320.field_2._M_allocated_capacity = 0;
      local_320._M_string_length = 0;
      if (paVar12->_M_local_buf[0] == '\x02') {
        local_320.field_2._M_allocated_capacity =
             (size_type)
             (((json_value *)(paVar12->_M_local_buf + 8))->array->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (paVar12->_M_local_buf[0] == '\x01') {
        local_320._M_string_length =
             (size_type)
             &(((json_value *)(paVar12->_M_local_buf + 8))->object->_M_t)._M_impl.
              super__Rb_tree_header;
      }
      else {
        local_320.field_2._8_8_ = 1;
      }
      local_320._M_dataplus._M_p = (pointer)paVar12;
      bVar6 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_300,
                         (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)&local_320);
      pbVar11 = local_200;
      if (!bVar6) {
        pdVar2 = &connections->interfaces;
        local_2e0 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)&connections->potentialInputs;
        do {
          pbVar11 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::detail::
                       iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                       ::operator*(&local_300);
          if (*pbVar11 ==
              (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               )0x3) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_2a8,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)pbVar11);
            pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *
                                 )pdVar2,&local_2a8.templateName);
            local_2d8._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
            local_2d8._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)local_2b0;
            local_2a8.templateName._M_string_length = (size_type)local_2b8;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                 SUB84(local_2d8._M_dataplus._M_p,0);
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                 (undefined2)((ulong)local_2d8._M_dataplus._M_p >> 0x20);
            local_2a8.templateName.field_2._M_local_buf[6] =
                 (char)((ulong)local_2d8._M_dataplus._M_p >> 0x30);
            local_2a8.templateName.field_2._M_local_buf[7] =
                 (char)((ulong)local_2d8._M_dataplus._M_p >> 0x38);
            local_2a8.templateName.field_2._8_3_ = (undefined3)local_2d8._M_string_length;
            local_2a8.templateName.field_2._M_local_buf[0xb] =
                 (char)(local_2d8._M_string_length >> 0x18);
            local_2a8.templateName.field_2._12_4_ = (undefined4)(local_2d8._M_string_length >> 0x20)
            ;
            local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
            std::
            _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                      ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_2e0,&local_2d8,&local_2a8);
          }
          else if (*pbVar11 ==
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    )0x1) {
            fileops::getName(&local_2d8,(json *)pbVar11);
            if ((pointer)local_2d8._M_string_length != (pointer)0x0) {
              pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string&>
                                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)pdVar2,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_2d8);
              local_1c0._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
              local_1c0._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
              local_2a8.templateName._M_dataplus._M_p = (pointer)local_2b0;
              local_2a8.templateName._M_string_length = (size_type)local_2b8;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                   SUB84(local_1c0._M_dataplus._M_p,0);
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                   (undefined2)((ulong)local_1c0._M_dataplus._M_p >> 0x20);
              local_2a8.templateName.field_2._M_local_buf[6] =
                   (char)((ulong)local_1c0._M_dataplus._M_p >> 0x30);
              local_2a8.templateName.field_2._M_local_buf[7] =
                   (char)((ulong)local_1c0._M_dataplus._M_p >> 0x38);
              local_2a8.templateName.field_2._8_3_ = (undefined3)local_1c0._M_string_length;
              local_2a8.templateName.field_2._M_local_buf[0xb] =
                   (char)(local_1c0._M_string_length >> 0x18);
              local_2a8.templateName.field_2._12_4_ =
                   (undefined4)(local_1c0._M_string_length >> 0x20);
              local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
              std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                        ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)local_2e0,&local_1c0,&local_2a8);
              local_60.field_2._M_allocated_capacity._0_4_ = 0x67726174;
              local_60._M_string_length = 7;
              local_60.field_2._M_allocated_capacity._4_4_ = 0x737465;
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              addPotentialTargets(connections,(string *)&local_2d8,&local_60,(json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,
                                CONCAT44(local_60.field_2._M_allocated_capacity._4_4_,
                                         local_60.field_2._M_allocated_capacity._0_4_) + 1);
              }
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6563;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
              local_2a8.templateName._M_string_length = 6;
              local_2a8.templateName.field_2._M_local_buf[6] = '\0';
              local_80.field_2._M_allocated_capacity = 0x746163696c627570;
              local_80.field_2._8_4_ = 0x736e6f69;
              local_80._M_string_length = 0xc;
              local_80.field_2._M_local_buf[0xc] = '\0';
              local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
              addPotentialTargetVariations
                        (connections,(string *)&local_2d8,&local_2a8.templateName,&local_80,
                         (json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6563;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
              local_2a8.templateName._M_string_length = 6;
              local_2a8.templateName.field_2._M_local_buf[6] = '\0';
              local_a0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
              local_a0._M_string_length = 7;
              local_a0.field_2._M_allocated_capacity._4_4_ = 0x737465;
              local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              addPotentialTargetVariations
                        (connections,(string *)&local_2d8,&local_2a8.templateName,&local_a0,
                         (json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,
                                CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                                         local_a0.field_2._M_allocated_capacity._0_4_) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              if ((*pbVar11 ==
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    )0x1) &&
                 (cVar7 = std::
                          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          ::_M_find_tr<char[6],void>
                                    (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                       **)(pbVar11 + 8),(char (*) [6])"alias"),
                 cVar7._M_node != (_Base_ptr)(*(long *)(pbVar11 + 8) + 8))) {
                pvVar8 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(pbVar11,"alias");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_2a8,pvVar8);
                pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)pdVar2,&local_2a8.templateName);
                local_180._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
                local_180._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                  operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                  CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                           CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                    CONCAT24(local_2a8.templateName.field_2.
                                                             _M_allocated_capacity._4_2_,
                                                             local_2a8.templateName.field_2.
                                                             _M_allocated_capacity._0_4_))) + 1);
                }
                local_2a8.templateName._M_dataplus._M_p = (pointer)local_2b0;
                local_2a8.templateName._M_string_length = (size_type)local_2b8;
                local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                     (uint)local_1c0._M_dataplus._M_p;
                local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                     (undefined2)((ulong)local_1c0._M_dataplus._M_p >> 0x20);
                local_2a8.templateName.field_2._M_local_buf[6] =
                     (char)((ulong)local_1c0._M_dataplus._M_p >> 0x30);
                local_2a8.templateName.field_2._8_3_ = (undefined3)local_1c0._M_string_length;
                local_2a8.templateName.field_2._7_4_ =
                     CONCAT31(local_2a8.templateName.field_2._8_3_,
                              (char)((ulong)local_1c0._M_dataplus._M_p >> 0x38));
                local_2a8.templateName.field_2._M_local_buf[0xb] =
                     (char)(local_1c0._M_string_length >> 0x18);
                local_2a8.templateName.field_2._12_4_ = local_1c0._M_string_length._4_4_;
                local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
                std::
                _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::
                _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                          ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)local_2e0,&local_180,&local_2a8);
                std::
                _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                ::
                _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&>
                          ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                            *)connections,0,&local_180,&local_1c0);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          vVar4 = ((local_300.m_object)->m_data).m_type;
          if (vVar4 == array) {
            local_300.m_it.array_iterator._M_current = local_300.m_it.array_iterator._M_current + 1;
          }
          else if (vVar4 == object) {
            local_300.m_it.object_iterator._M_node =
                 (_Base_ptr)std::_Rb_tree_increment(local_300.m_it.object_iterator._M_node);
          }
          else {
            local_300.m_it.primitive_iterator.m_it = local_300.m_it.primitive_iterator.m_it + 1;
          }
          bVar6 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::
                  operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                            (&local_300,
                             (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)&local_320);
          pbVar11 = local_200;
        } while (!bVar6);
      }
    }
    if ((*pbVar11 ==
         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          )0x1) &&
       (cVar7 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                ::_M_find_tr<char[13],void>
                          (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             **)(pbVar11 + 8),(char (*) [13])0x4176c3),
       cVar7._M_node != (_Base_ptr)(*(long *)(pbVar11 + 8) + 8))) {
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar11,"publications");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::cbegin(&local_300,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)paVar12);
      local_320.field_2._8_8_ = 0x8000000000000000;
      local_320.field_2._M_allocated_capacity = 0;
      local_320._M_string_length = 0;
      if (paVar12->_M_local_buf[0] == '\x02') {
        local_320.field_2._M_allocated_capacity =
             (size_type)
             (((json_value *)(paVar12->_M_local_buf + 8))->array->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (paVar12->_M_local_buf[0] == '\x01') {
        local_320._M_string_length =
             (size_type)
             &(((json_value *)(paVar12->_M_local_buf + 8))->object->_M_t)._M_impl.
              super__Rb_tree_header;
      }
      else {
        local_320.field_2._8_8_ = 1;
      }
      local_320._M_dataplus._M_p = (pointer)paVar12;
      bVar6 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_300,
                         (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)&local_320);
      pbVar11 = local_200;
      if (!bVar6) {
        pdVar2 = &connections->interfaces;
        local_2e0 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)&connections->potentialPubs;
        do {
          pbVar11 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::detail::
                       iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                       ::operator*(&local_300);
          if (*pbVar11 ==
              (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               )0x3) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_2a8,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)pbVar11);
            pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *
                                 )pdVar2,&local_2a8.templateName);
            local_2d8._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
            local_2d8._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)local_2b0;
            local_2a8.templateName._M_string_length = (size_type)local_2b8;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                 SUB84(local_2d8._M_dataplus._M_p,0);
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                 (undefined2)((ulong)local_2d8._M_dataplus._M_p >> 0x20);
            local_2a8.templateName.field_2._M_local_buf[6] =
                 (char)((ulong)local_2d8._M_dataplus._M_p >> 0x30);
            local_2a8.templateName.field_2._M_local_buf[7] =
                 (char)((ulong)local_2d8._M_dataplus._M_p >> 0x38);
            local_2a8.templateName.field_2._8_3_ = (undefined3)local_2d8._M_string_length;
            local_2a8.templateName.field_2._M_local_buf[0xb] =
                 (char)(local_2d8._M_string_length >> 0x18);
            local_2a8.templateName.field_2._12_4_ = (undefined4)(local_2d8._M_string_length >> 0x20)
            ;
            local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
            std::
            _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                      ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_2e0,&local_2d8,&local_2a8);
          }
          else if (*pbVar11 ==
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    )0x1) {
            fileops::getName(&local_2d8,(json *)pbVar11);
            if ((pointer)local_2d8._M_string_length != (pointer)0x0) {
              pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string&>
                                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)pdVar2,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_2d8);
              local_1e0._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
              local_1e0._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
              local_2a8.templateName._M_dataplus._M_p = (pointer)local_2b0;
              local_2a8.templateName._M_string_length = (size_type)local_2b8;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                   SUB84(local_1e0._M_dataplus._M_p,0);
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                   (undefined2)((ulong)local_1e0._M_dataplus._M_p >> 0x20);
              local_2a8.templateName.field_2._M_local_buf[6] =
                   (char)((ulong)local_1e0._M_dataplus._M_p >> 0x30);
              local_2a8.templateName.field_2._M_local_buf[7] =
                   (char)((ulong)local_1e0._M_dataplus._M_p >> 0x38);
              local_2a8.templateName.field_2._8_3_ = (undefined3)local_1e0._M_string_length;
              local_2a8.templateName.field_2._M_local_buf[0xb] =
                   (char)(local_1e0._M_string_length >> 0x18);
              local_2a8.templateName.field_2._12_4_ =
                   (undefined4)(local_1e0._M_string_length >> 0x20);
              local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
              std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                        ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)local_2e0,&local_1e0,&local_2a8);
              local_1c0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
              local_1c0._M_string_length = 7;
              local_1c0.field_2._M_allocated_capacity._4_4_ = 0x737465;
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              addPotentialTargets(connections,(string *)&local_2d8,&local_1c0,(json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                CONCAT44(local_1c0.field_2._M_allocated_capacity._4_4_,
                                         local_1c0.field_2._M_allocated_capacity._0_4_) + 1);
              }
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x74736564;
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6e69;
              local_2a8.templateName.field_2._M_local_buf[6] = 'a';
              local_2a8.templateName.field_2._7_4_ = 0x6e6f6974;
              local_2a8.templateName._M_string_length = 0xb;
              local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
              local_180.field_2._M_allocated_capacity._4_2_ = 0x7374;
              local_180.field_2._M_allocated_capacity._0_4_ = 0x75706e69;
              local_180._M_string_length = 6;
              local_180.field_2._M_local_buf[6] = '\0';
              local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              addPotentialTargetVariations
                        (connections,(string *)&local_2d8,&local_2a8.templateName,&local_180,
                         (json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                CONCAT17(local_180.field_2._M_local_buf[7],
                                         CONCAT16(local_180.field_2._M_local_buf[6],
                                                  CONCAT24(local_180.field_2._M_allocated_capacity.
                                                           _4_2_,local_180.field_2.
                                                                 _M_allocated_capacity._0_4_))) + 1)
                ;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x74736564;
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6e69;
              local_2a8.templateName.field_2._M_local_buf[6] = 'a';
              local_2a8.templateName.field_2._7_4_ = 0x6e6f6974;
              local_2a8.templateName._M_string_length = 0xb;
              local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
              local_c0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
              local_c0._M_string_length = 7;
              local_c0.field_2._M_allocated_capacity._4_4_ = 0x737465;
              local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              addPotentialTargetVariations
                        (connections,(string *)&local_2d8,&local_2a8.templateName,&local_c0,
                         (json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,
                                CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                                         local_c0.field_2._M_allocated_capacity._0_4_) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              if ((*pbVar11 ==
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    )0x1) &&
                 (cVar7 = std::
                          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          ::_M_find_tr<char[6],void>
                                    (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                       **)(pbVar11 + 8),(char (*) [6])"alias"),
                 cVar7._M_node != (_Base_ptr)(*(long *)(pbVar11 + 8) + 8))) {
                pvVar8 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(pbVar11,"alias");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_2a8,pvVar8);
                pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)pdVar2,&local_2a8.templateName);
                local_1a0._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
                local_1a0._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                  operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                  CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                           CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                    CONCAT24(local_2a8.templateName.field_2.
                                                             _M_allocated_capacity._4_2_,
                                                             local_2a8.templateName.field_2.
                                                             _M_allocated_capacity._0_4_))) + 1);
                }
                local_2a8.templateName._M_dataplus._M_p = (pointer)local_2b0;
                local_2a8.templateName._M_string_length = (size_type)local_2b8;
                local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                     (uint)local_1e0._M_dataplus._M_p;
                local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                     (undefined2)((ulong)local_1e0._M_dataplus._M_p >> 0x20);
                local_2a8.templateName.field_2._M_local_buf[6] =
                     (char)((ulong)local_1e0._M_dataplus._M_p >> 0x30);
                local_2a8.templateName.field_2._8_3_ = (undefined3)local_1e0._M_string_length;
                local_2a8.templateName.field_2._7_4_ =
                     CONCAT31(local_2a8.templateName.field_2._8_3_,
                              (char)((ulong)local_1e0._M_dataplus._M_p >> 0x38));
                local_2a8.templateName.field_2._M_local_buf[0xb] =
                     (char)(local_1e0._M_string_length >> 0x18);
                local_2a8.templateName.field_2._12_4_ = local_1e0._M_string_length._4_4_;
                local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
                std::
                _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::
                _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                          ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)local_2e0,&local_1a0,&local_2a8);
                std::
                _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                ::
                _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&>
                          ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                            *)connections,0,&local_1a0,&local_1e0);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          vVar4 = ((local_300.m_object)->m_data).m_type;
          if (vVar4 == array) {
            local_300.m_it.array_iterator._M_current = local_300.m_it.array_iterator._M_current + 1;
          }
          else if (vVar4 == object) {
            local_300.m_it.object_iterator._M_node =
                 (_Base_ptr)std::_Rb_tree_increment(local_300.m_it.object_iterator._M_node);
          }
          else {
            local_300.m_it.primitive_iterator.m_it = local_300.m_it.primitive_iterator.m_it + 1;
          }
          bVar6 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::
                  operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                            (&local_300,
                             (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)&local_320);
          pbVar11 = local_200;
        } while (!bVar6);
      }
    }
    if ((*pbVar11 ==
         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          )0x1) &&
       (cVar7 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                ::_M_find_tr<char[10],void>
                          (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             **)(pbVar11 + 8),(char (*) [10])0x4183f6),
       cVar7._M_node != (_Base_ptr)(*(long *)(pbVar11 + 8) + 8))) {
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar11,"endpoints");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::cbegin(&local_300,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)paVar13);
      local_320.field_2._8_8_ = 0x8000000000000000;
      local_320.field_2._M_allocated_capacity = 0;
      local_320._M_string_length = 0;
      if (paVar13->_M_local_buf[0] == '\x02') {
        local_320.field_2._M_allocated_capacity =
             (size_type)
             (((json_value *)(paVar13->_M_local_buf + 8))->array->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (paVar13->_M_local_buf[0] == '\x01') {
        local_320._M_string_length =
             (size_type)
             &(((json_value *)(paVar13->_M_local_buf + 8))->object->_M_t)._M_impl.
              super__Rb_tree_header;
      }
      else {
        local_320.field_2._8_8_ = 1;
      }
      local_320._M_dataplus._M_p = (pointer)paVar13;
      bVar6 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_300,
                         (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)&local_320);
      pbVar11 = local_200;
      if (!bVar6) {
        local_2e0 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)&connections->interfaces;
        local_1e8 = (_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                     *)&connections->potentialEndpoints;
        do {
          pbVar11 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::detail::
                       iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                       ::operator*(&local_300);
          if (*pbVar11 ==
              (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               )0x1) {
            fileops::getName(&local_2d8,(json *)pbVar11);
            if ((pointer)local_2d8._M_string_length != (pointer)0x0) {
              pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string&>
                                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)local_2e0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_2d8);
              uStack_1f0 = (pvVar10->_M_dataplus)._M_p;
              local_1f8 = pvVar10->_M_string_length;
              local_2a8.templateName._M_dataplus._M_p = (pointer)local_2b0;
              local_2a8.templateName._M_string_length = (size_type)local_2b8;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)local_1f8;
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                   (undefined2)(local_1f8 >> 0x20);
              local_2a8.templateName.field_2._M_local_buf[6] = (char)(local_1f8 >> 0x30);
              local_2a8.templateName.field_2._M_local_buf[7] = (char)(local_1f8 >> 0x38);
              local_2a8.templateName.field_2._8_3_ = SUB83(uStack_1f0,0);
              local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)uStack_1f0 >> 0x18);
              local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)uStack_1f0 >> 0x20);
              local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
              std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                        (local_1e8,&local_1f8,&local_2a8);
              local_1e0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
              local_1e0._M_string_length = 7;
              local_1e0.field_2._M_allocated_capacity._4_4_ = 0x737465;
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              addPotentialTargets(connections,(string *)&local_2d8,&local_1e0,(json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                                         local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
              }
              local_1a0.field_2._8_5_ = 0x736e6f6974;
              local_1a0.field_2._M_allocated_capacity._0_5_ = 0x6373627573;
              local_1a0.field_2._M_allocated_capacity._5_3_ = 0x706972;
              local_1a0._M_string_length = 0xd;
              local_1a0.field_2._M_local_buf[0xd] = '\0';
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              addPotentialTargets(connections,(string *)&local_2d8,&local_1a0,(json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                CONCAT35(local_1a0.field_2._M_allocated_capacity._5_3_,
                                         local_1a0.field_2._M_allocated_capacity._0_5_) + 1);
              }
              local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6563;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
              local_2a8.templateName._M_string_length = 6;
              local_2a8.templateName.field_2._M_local_buf[6] = '\0';
              local_e0.field_2._M_allocated_capacity._4_2_ = 0x7374;
              local_e0.field_2._M_allocated_capacity._0_4_ = 0x75706e69;
              local_e0._M_string_length = 6;
              local_e0.field_2._M_local_buf[6] = '\0';
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              addPotentialTargetVariations
                        (connections,(string *)&local_2d8,&local_2a8.templateName,&local_e0,
                         (json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,
                                CONCAT17(local_e0.field_2._M_local_buf[7],
                                         CONCAT16(local_e0.field_2._M_local_buf[6],
                                                  CONCAT24(local_e0.field_2._M_allocated_capacity.
                                                           _4_2_,local_e0.field_2.
                                                                 _M_allocated_capacity._0_4_))) + 1)
                ;
              }
              paVar13 = &local_2a8.templateName.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6563;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
              local_2a8.templateName._M_string_length = 6;
              local_2a8.templateName.field_2._M_local_buf[6] = '\0';
              local_100.field_2._M_allocated_capacity = 0x746e696f70646e65;
              local_100.field_2._M_local_buf[8] = 's';
              local_100._M_string_length = 9;
              local_100.field_2._M_local_buf[9] = '\0';
              local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              addPotentialTargetVariations
                        (connections,(string *)&local_2d8,&local_2a8.templateName,&local_100,
                         (json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6563;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
              local_2a8.templateName._M_string_length = 6;
              local_2a8.templateName.field_2._M_local_buf[6] = '\0';
              local_120.field_2._M_allocated_capacity._0_4_ = 0x67726174;
              local_120._M_string_length = 7;
              local_120.field_2._M_allocated_capacity._4_4_ = 0x737465;
              local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              addPotentialTargetVariations
                        (connections,(string *)&local_2d8,&local_2a8.templateName,&local_120,
                         (json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                CONCAT44(local_120.field_2._M_allocated_capacity._4_4_,
                                         local_120.field_2._M_allocated_capacity._0_4_) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x74736564;
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6e69;
              local_2a8.templateName.field_2._M_local_buf[6] = 'a';
              local_2a8.templateName.field_2._7_4_ = 0x6e6f6974;
              local_2a8.templateName._M_string_length = 0xb;
              local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
              local_140.field_2._M_allocated_capacity = 0x746e696f70646e65;
              local_140.field_2._M_local_buf[8] = 's';
              local_140._M_string_length = 9;
              local_140.field_2._M_local_buf[9] = '\0';
              local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              addPotentialTargetVariations
                        (connections,(string *)&local_2d8,&local_2a8.templateName,&local_140,
                         (json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x74736564;
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6e69;
              local_2a8.templateName.field_2._M_local_buf[6] = 'a';
              local_2a8.templateName.field_2._7_4_ = 0x6e6f6974;
              local_2a8.templateName._M_string_length = 0xb;
              local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
              local_160.field_2._M_allocated_capacity._0_4_ = 0x67726174;
              local_160._M_string_length = 7;
              local_160.field_2._M_allocated_capacity._4_4_ = 0x737465;
              local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              addPotentialTargetVariations
                        (connections,(string *)&local_2d8,&local_2a8.templateName,&local_160,
                         (json *)pbVar11);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                CONCAT44(local_160.field_2._M_allocated_capacity._4_4_,
                                         local_160.field_2._M_allocated_capacity._0_4_) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              if ((*pbVar11 ==
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    )0x1) &&
                 (cVar7 = std::
                          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          ::_M_find_tr<char[6],void>
                                    (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                       **)(pbVar11 + 8),(char (*) [6])"alias"),
                 cVar7._M_node != (_Base_ptr)(*(long *)(pbVar11 + 8) + 8))) {
                pvVar8 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(pbVar11,"alias");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_2a8,pvVar8);
                pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)local_2e0,&local_2a8.templateName);
                local_38 = (pvVar10->_M_dataplus)._M_p;
                local_40 = pvVar10->_M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
                  operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                  CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                           CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                    CONCAT24(local_2a8.templateName.field_2.
                                                             _M_allocated_capacity._4_2_,
                                                             local_2a8.templateName.field_2.
                                                             _M_allocated_capacity._0_4_))) + 1);
                }
                local_2a8.templateName._M_dataplus._M_p = (pointer)local_2b0;
                local_2a8.templateName._M_string_length = (size_type)local_2b8;
                local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (uint)local_1f8;
                local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                     (undefined2)(local_1f8 >> 0x20);
                local_2a8.templateName.field_2._M_local_buf[6] = (char)(local_1f8 >> 0x30);
                local_2a8.templateName.field_2._8_3_ = SUB83(uStack_1f0,0);
                local_2a8.templateName.field_2._7_4_ =
                     CONCAT31(local_2a8.templateName.field_2._8_3_,(char)(local_1f8 >> 0x38));
                local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)uStack_1f0 >> 0x18)
                ;
                local_2a8.templateName.field_2._12_4_ = uStack_1f0._4_4_;
                local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
                std::
                _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::
                _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                          (local_1e8,&local_40,&local_2a8);
                std::
                _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                ::
                _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&>
                          ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                            *)connections,0,&local_40,&local_1f8);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_2a8,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)pbVar11);
            pvVar10 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *
                                 )local_2e0,&local_2a8.templateName);
            local_2d8._M_string_length = (size_type)(pvVar10->_M_dataplus)._M_p;
            local_2d8._M_dataplus._M_p = (pointer)pvVar10->_M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)local_2b0;
            local_2a8.templateName._M_string_length = (size_type)local_2b8;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                 SUB84(local_2d8._M_dataplus._M_p,0);
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                 (undefined2)((ulong)local_2d8._M_dataplus._M_p >> 0x20);
            local_2a8.templateName.field_2._M_local_buf[6] =
                 (char)((ulong)local_2d8._M_dataplus._M_p >> 0x30);
            local_2a8.templateName.field_2._M_local_buf[7] =
                 (char)((ulong)local_2d8._M_dataplus._M_p >> 0x38);
            local_2a8.templateName.field_2._8_3_ = (undefined3)local_2d8._M_string_length;
            local_2a8.templateName.field_2._M_local_buf[0xb] =
                 (char)(local_2d8._M_string_length >> 0x18);
            local_2a8.templateName.field_2._12_4_ = (undefined4)(local_2d8._M_string_length >> 0x20)
            ;
            local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
            std::
            _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                      (local_1e8,&local_2d8,&local_2a8);
          }
          vVar4 = ((local_300.m_object)->m_data).m_type;
          if (vVar4 == array) {
            local_300.m_it.array_iterator._M_current = local_300.m_it.array_iterator._M_current + 1;
          }
          else if (vVar4 == object) {
            local_300.m_it.object_iterator._M_node =
                 (_Base_ptr)std::_Rb_tree_increment(local_300.m_it.object_iterator._M_node);
          }
          else {
            local_300.m_it.primitive_iterator.m_it = local_300.m_it.primitive_iterator.m_it + 1;
          }
          bVar6 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::
                  operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                            (&local_300,
                             (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)&local_320);
          pbVar11 = local_200;
        } while (!bVar6);
      }
    }
    paVar13 = &local_2a8.templateName.field_2;
    if ((*pbVar11 ==
         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          )0x1) &&
       (cVar7 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                ::_M_find_tr<char[22],void>
                          (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             **)(pbVar11 + 8),(char (*) [22])"publication_templates"),
       cVar7._M_node != (_Base_ptr)(*(long *)(pbVar11 + 8) + 8))) {
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar11,"publication_templates");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::cbegin(&local_300,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)paVar12);
      local_320.field_2._8_8_ = 0x8000000000000000;
      local_320.field_2._M_allocated_capacity = 0;
      local_320._M_string_length = 0;
      if (paVar12->_M_local_buf[0] == '\x02') {
        local_320.field_2._M_allocated_capacity =
             (size_type)
             (((json_value *)(paVar12->_M_local_buf + 8))->array->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (paVar12->_M_local_buf[0] == '\x01') {
        local_320._M_string_length =
             (size_type)
             &(((json_value *)(paVar12->_M_local_buf + 8))->object->_M_t)._M_impl.
              super__Rb_tree_header;
      }
      else {
        local_320.field_2._8_8_ = 1;
      }
      local_320._M_dataplus._M_p = (pointer)paVar12;
      bVar6 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_300,
                         (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)&local_320);
      pbVar11 = local_200;
      if (!bVar6) {
        local_2e0 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)&connections->potentialPublicationTemplates;
        do {
          pbVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&local_300);
          if ((pbVar9->m_data).m_type == object) {
            local_2a8.templateName._M_string_length = 0;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                 local_2a8.templateName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
            local_2a8.keys.
            super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.keys.
            super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.intermediaries.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.keys.
            super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.intermediaries.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.intermediaries.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.usedTemplates.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.usedTemplates.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.templatePossibilities.
            super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.usedTemplates.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.templatePossibilities.
            super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.templatePossibilities.
            super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.federate._M_len = 0;
            local_2a8.federate._M_str = (char *)0x0;
            local_2d8._M_dataplus._M_p = (pointer)0x0;
            __l._M_len = 1;
            __l._M_array = (iterator)&local_2d8;
            local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
            CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_2a8.combinations,__l,(allocator_type *)&local_1f8);
            local_2a8.federate._M_len = (size_t)local_2b0;
            local_2a8.federate._M_str = (char *)local_2b8;
            bVar6 = TemplateMatcher::loadTemplate(&local_2a8,pbVar9);
            if (bVar6) {
              CLI::std::
              vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              ::emplace_back<helics::apps::TemplateMatcher>
                        ((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                          *)local_2e0,&local_2a8);
            }
            if (local_2a8.combinations.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2a8.combinations.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_2a8.combinations.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_2a8.combinations.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            CLI::std::
            vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~vector(&local_2a8.keys);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_2a8.intermediaries);
            CLI::std::
            vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_2a8.usedTemplates);
            CLI::std::
            vector<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::~vector(&local_2a8.templatePossibilities);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
          }
          vVar4 = ((local_300.m_object)->m_data).m_type;
          if (vVar4 == array) {
            local_300.m_it.array_iterator._M_current = local_300.m_it.array_iterator._M_current + 1;
          }
          else if (vVar4 == object) {
            local_300.m_it.object_iterator._M_node =
                 (_Base_ptr)std::_Rb_tree_increment(local_300.m_it.object_iterator._M_node);
          }
          else {
            local_300.m_it.primitive_iterator.m_it = local_300.m_it.primitive_iterator.m_it + 1;
          }
          bVar6 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::
                  operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                            (&local_300,
                             (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)&local_320);
          pbVar11 = local_200;
        } while (!bVar6);
      }
    }
    if ((*pbVar11 ==
         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          )0x1) &&
       (cVar7 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                ::_M_find_tr<char[16],void>
                          (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             **)(pbVar11 + 8),(char (*) [16])"input_templates"),
       cVar7._M_node != (_Base_ptr)(*(long *)(pbVar11 + 8) + 8))) {
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar11,"input_templates");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::cbegin(&local_300,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)paVar12);
      local_320.field_2._8_8_ = 0x8000000000000000;
      local_320.field_2._M_allocated_capacity = 0;
      local_320._M_string_length = 0;
      if (paVar12->_M_local_buf[0] == '\x02') {
        local_320.field_2._M_allocated_capacity =
             (size_type)
             (((json_value *)(paVar12->_M_local_buf + 8))->array->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (paVar12->_M_local_buf[0] == '\x01') {
        local_320._M_string_length =
             (size_type)
             &(((json_value *)(paVar12->_M_local_buf + 8))->object->_M_t)._M_impl.
              super__Rb_tree_header;
      }
      else {
        local_320.field_2._8_8_ = 1;
      }
      local_320._M_dataplus._M_p = (pointer)paVar12;
      bVar6 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_300,
                         (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)&local_320);
      pbVar11 = local_200;
      if (!bVar6) {
        local_2e0 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)&connections->potentialInputTemplates;
        do {
          pbVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&local_300);
          if ((pbVar9->m_data).m_type == object) {
            local_2a8.templateName._M_string_length = 0;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                 local_2a8.templateName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
            local_2a8.keys.
            super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.keys.
            super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.intermediaries.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.keys.
            super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.intermediaries.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.intermediaries.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.usedTemplates.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.usedTemplates.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.templatePossibilities.
            super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.usedTemplates.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.templatePossibilities.
            super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.templatePossibilities.
            super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.federate._M_len = 0;
            local_2a8.federate._M_str = (char *)0x0;
            local_2d8._M_dataplus._M_p = (pointer)0x0;
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)&local_2d8;
            local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
            CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_2a8.combinations,__l_00,(allocator_type *)&local_1f8);
            local_2a8.federate._M_len = (size_t)local_2b0;
            local_2a8.federate._M_str = (char *)local_2b8;
            bVar6 = TemplateMatcher::loadTemplate(&local_2a8,pbVar9);
            if (bVar6) {
              CLI::std::
              vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              ::emplace_back<helics::apps::TemplateMatcher>
                        ((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                          *)local_2e0,&local_2a8);
            }
            if (local_2a8.combinations.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2a8.combinations.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_2a8.combinations.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_2a8.combinations.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            CLI::std::
            vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~vector(&local_2a8.keys);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_2a8.intermediaries);
            CLI::std::
            vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_2a8.usedTemplates);
            CLI::std::
            vector<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::~vector(&local_2a8.templatePossibilities);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
          }
          vVar4 = ((local_300.m_object)->m_data).m_type;
          if (vVar4 == array) {
            local_300.m_it.array_iterator._M_current = local_300.m_it.array_iterator._M_current + 1;
          }
          else if (vVar4 == object) {
            local_300.m_it.object_iterator._M_node =
                 (_Base_ptr)std::_Rb_tree_increment(local_300.m_it.object_iterator._M_node);
          }
          else {
            local_300.m_it.primitive_iterator.m_it = local_300.m_it.primitive_iterator.m_it + 1;
          }
          bVar6 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::
                  operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                            (&local_300,
                             (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)&local_320);
          pbVar11 = local_200;
        } while (!bVar6);
      }
    }
    if ((*pbVar11 ==
         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          )0x1) &&
       (cVar7 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                ::_M_find_tr<char[19],void>
                          (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             **)(pbVar11 + 8),(char (*) [19])"endpoint_templates"),
       cVar7._M_node != (_Base_ptr)(*(long *)(pbVar11 + 8) + 8))) {
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar11,"endpoint_templates");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::cbegin(&local_300,pvVar8);
      vVar4 = (pvVar8->m_data).m_type;
      local_320.field_2._8_8_ = 0x8000000000000000;
      local_320.field_2._M_allocated_capacity = 0;
      local_320._M_string_length = 0;
      if (vVar4 == array) {
        local_320.field_2._M_allocated_capacity =
             (size_type)
             (((pvVar8->m_data).m_value.array)->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (vVar4 == object) {
        local_320._M_string_length =
             (size_type)&(((pvVar8->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      else {
        local_320.field_2._8_8_ = 1;
      }
      local_320._M_dataplus._M_p = (pointer)pvVar8;
      bVar6 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_300,
                         (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)&local_320);
      if (!bVar6) {
        do {
          pbVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&local_300);
          if ((pbVar9->m_data).m_type == object) {
            local_2a8.templateName._M_string_length = 0;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                 local_2a8.templateName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
            local_2a8.keys.
            super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.keys.
            super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.intermediaries.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.keys.
            super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.intermediaries.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.intermediaries.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.usedTemplates.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.usedTemplates.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.templatePossibilities.
            super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8.usedTemplates.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.templatePossibilities.
            super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.templatePossibilities.
            super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.federate._M_len = 0;
            local_2a8.federate._M_str = (char *)0x0;
            local_2d8._M_dataplus._M_p = (pointer)0x0;
            __l_01._M_len = 1;
            __l_01._M_array = (iterator)&local_2d8;
            local_2a8.templateName._M_dataplus._M_p = (pointer)paVar13;
            CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_2a8.combinations,__l_01,(allocator_type *)&local_1f8);
            local_2a8.federate._M_len = (size_t)local_2b0;
            local_2a8.federate._M_str = (char *)local_2b8;
            bVar6 = TemplateMatcher::loadTemplate(&local_2a8,pbVar9);
            if (bVar6) {
              CLI::std::
              vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              ::emplace_back<helics::apps::TemplateMatcher>
                        (&connections->potentialEndpointTemplates,&local_2a8);
            }
            if (local_2a8.combinations.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2a8.combinations.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_2a8.combinations.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_2a8.combinations.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            CLI::std::
            vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~vector(&local_2a8.keys);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_2a8.intermediaries);
            CLI::std::
            vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_2a8.usedTemplates);
            CLI::std::
            vector<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::~vector(&local_2a8.templatePossibilities);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != paVar13) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
          }
          vVar4 = ((local_300.m_object)->m_data).m_type;
          if (vVar4 == array) {
            local_300.m_it.array_iterator._M_current = local_300.m_it.array_iterator._M_current + 1;
          }
          else if (vVar4 == object) {
            local_300.m_it.object_iterator._M_node =
                 (_Base_ptr)std::_Rb_tree_increment(local_300.m_it.object_iterator._M_node);
          }
          else {
            local_300.m_it.primitive_iterator.m_it = local_300.m_it.primitive_iterator.m_it + 1;
          }
          bVar6 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::
                  operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                            (&local_300,
                             (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)&local_320);
        } while (!bVar6);
      }
    }
  }
  return;
}

Assistant:

static void fedConnectionList(ConnectionsList& connections, const nlohmann::json& fed)
{
    try {
        if (fed.contains("tags")) {
            loadTags(connections, fed["tags"]);
        }
        if (fed.contains("connected_inputs")) {
            for (const auto& input : fed["connected_inputs"]) {
                const std::string_view input1 =
                    connections.interfaces.emplace_back(input.get<std::string>());
                connections.inputs.insert(input1);
            }
        }
        if (fed.contains("connected_publications")) {
            for (const auto& pub : fed["connected_publications"]) {
                const std::string_view pub1 =
                    connections.interfaces.emplace_back(pub.get<std::string>());
                connections.pubs.insert(pub1);
            }
        }
        if (fed.contains("unconnected_inputs")) {
            for (const auto& input : fed["unconnected_inputs"]) {
                const std::string_view input1 =
                    connections.interfaces.emplace_back(input.get<std::string>());
                connections.unconnectedInputs.push_back(input1);
                connections.inputs.insert(input1);
            }
        }
        if (fed.contains("unconnected_publications")) {
            for (const auto& pub : fed["unconnected_publications"]) {
                const std::string_view pub1 =
                    connections.interfaces.emplace_back(pub.get<std::string>());
                connections.unconnectedPubs.push_back(pub1);
                connections.pubs.insert(pub1);
            }
        }

        if (fed.contains("unconnected_target_endpoints")) {
            for (const auto& endpoint : fed["unconnected_target_endpoints"]) {
                const std::string_view end1 =
                    connections.interfaces.emplace_back(endpoint.get<std::string>());
                connections.unconnectedTargetEndpoints.push_back(end1);
                connections.endpoints.insert(end1);
            }
        }
        if (fed.contains("unconnected_source_endpoints")) {
            for (const auto& endpoint : fed["unconnected_source_endpoints"]) {
                const std::string_view end1 =
                    connections.interfaces.emplace_back(endpoint.get<std::string>());
                connections.unconnectedSourceEndpoints.push_back(end1);
                connections.endpoints.insert(end1);
            }
        }
        if (fed.contains("connected_endpoints")) {
            for (const auto& endpoint : fed["connected_endpoints"]) {
                const std::string_view end1 =
                    connections.interfaces.emplace_back(endpoint.get<std::string>());
                connections.endpoints.insert(end1);
            }
        }
        if (fed.contains("potential_interfaces")) {
            fedPotentialInterfaceList(connections, fed);
        }
    }
    catch (const nlohmann::json::exception& /*ev*/) {
        // TODO(PT): I think this is going to be almost impossible now, but someday might
        // want to create a response
        return;
    }
}